

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCGeometry.cpp
# Opt level: O3

void Assimp::IFC::ProcessRevolvedAreaSolid
               (IfcRevolvedAreaSolid *solid,TempMesh *result,ConversionData *conv)

{
  pointer *ppaVar1;
  double *pdVar2;
  long lVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this;
  IfcRevolvedAreaSolid *pIVar4;
  bool bVar5;
  int iVar6;
  IfcProfileDef *pIVar7;
  IfcAxis1Placement *in;
  ulong uVar8;
  IfcAxis2Placement3D *in_00;
  pointer paVar9;
  ulong uVar10;
  size_t __n;
  aiVector3t<double> *paVar11;
  iterator iVar12;
  pointer __src;
  long lVar13;
  ulong uVar14;
  long lVar15;
  pointer paVar16;
  ulong uVar17;
  long lVar18;
  bool bVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  aiVector3t<double> res;
  IfcVector3 base_1;
  TempMesh meshout;
  IfcVector3 axis;
  IfcVector3 pos;
  IfcMatrix4 trafo;
  aiVector3t<double> local_1a8;
  ulong local_190;
  pointer local_188;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_180;
  aiVector3t<double> local_178;
  TempMesh local_158;
  undefined1 local_128 [16];
  double local_118;
  double dStack_110;
  IfcVector3 local_108;
  IfcRevolvedAreaSolid *local_f0;
  IfcVector3 local_e8;
  double local_c8;
  double dStack_c0;
  IfcMatrix4 local_b8;
  
  local_158.mVertcnt.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158.mVertcnt.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_158.mVerts.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_158.mVertcnt.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.mVerts.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.mVerts.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pIVar7 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcProfileDef>
                     (*(LazyObject **)
                       &(solid->super_IfcSweptAreaSolid).super_IfcSolidModel.field_0x40);
  bVar5 = ProcessProfile(pIVar7,&local_158,conv);
  if ((bVar5) &&
     (1 < (ulong)(((long)local_158.mVerts.
                         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_158.mVerts.
                         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555))) {
    local_108.x = 0.0;
    local_108.y = 0.0;
    local_108.z = 0.0;
    local_e8.z = 0.0;
    local_e8.x = 0.0;
    local_e8.y = 0.0;
    in = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcAxis1Placement>
                   (*(LazyObject **)&(solid->super_IfcSweptAreaSolid).field_0x60);
    ConvertAxisPlacement(&local_108,&local_e8,in);
    dVar43 = local_e8.z;
    paVar9 = local_158.mVerts.
             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
    paVar16 = local_158.mVerts.
              super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_118 = local_e8.x;
    dStack_110 = local_e8.y;
    pIVar7 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcProfileDef>
                       (*(LazyObject **)
                         &(solid->super_IfcSweptAreaSolid).super_IfcSolidModel.field_0x40);
    local_188 = paVar16;
    lVar13 = (long)paVar9 - (long)paVar16 >> 3;
    uVar14 = lVar13 * -0x5555555555555555;
    iVar6 = std::__cxx11::string::compare
                      (&(pIVar7->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>).
                        field_0x10);
    dVar20 = solid->Angle * conv->angle_scale;
    dVar22 = ABS(dVar20);
    if (0.001 <= dVar22) {
      uVar8 = (ulong)(((double)conv->settings->cylindricalTessellation * dVar22) /
                     1.5707963705062866);
      uVar17 = 2;
      if (2 < (uint)uVar8) {
        uVar17 = uVar8 & 0xffffffff;
      }
      bVar5 = (2 < uVar14 && iVar6 == 0) && dVar22 < 6.220353627204895;
      std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::reserve
                (&result->mVerts,((uint)bVar5 * 2 + (int)uVar17 * 4 + 4) * uVar14);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
                (&result->mVertcnt,uVar17 * uVar14 + 2);
      dVar20 = dVar20 / (double)uVar17;
      local_180 = &result->mVertcnt;
      dVar22 = cos(dVar20);
      dVar20 = ::sin(dVar20);
      dVar35 = local_108.z;
      dVar23 = local_108.y;
      paVar16 = local_188;
      local_190 = uVar17;
      local_f0 = solid;
      if (paVar9 == local_188) {
        uVar8 = uVar14 + (uVar14 == 0);
        local_128._0_8_ = local_108.x;
      }
      else {
        local_128._0_8_ = local_108.x;
        uVar8 = uVar14 + (uVar14 == 0);
        lVar15 = 0;
        uVar17 = uVar8;
        do {
          std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::_M_fill_insert
                    (&result->mVerts,
                     (result->mVerts).
                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish,4,
                     (value_type *)
                     ((long)&(local_158.mVerts.
                              super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->x + lVar15));
          lVar15 = lVar15 + 0x18;
          uVar17 = uVar17 - 1;
        } while (uVar17 != 0);
      }
      dVar21 = 1.0 - dVar22;
      dVar24 = dVar21 * (double)local_128._0_8_;
      dVar32 = dVar24 * (double)local_128._0_8_ + dVar22;
      dVar39 = dVar24 * dVar23 - dVar20 * dVar35;
      dVar41 = dVar24 * dVar35 + dVar20 * dVar23;
      dVar26 = dVar24 * dVar23 + dVar20 * dVar35;
      dVar34 = dVar23 * dVar21 * dVar23 + dVar22;
      dVar25 = dVar21 * dVar23 * dVar35;
      dVar28 = dVar25 - dVar20 * (double)local_128._0_8_;
      dVar24 = dVar24 * dVar35 - dVar20 * dVar23;
      dVar25 = dVar25 + dVar20 * (double)local_128._0_8_;
      dVar22 = dVar21 * dVar35 * dVar35 + dVar22;
      dVar35 = dVar26 * 0.0;
      dVar30 = dVar34 * 0.0;
      dVar21 = dVar32 * 0.0;
      dVar38 = dVar28 * 0.0;
      dVar40 = dVar39 * 0.0;
      dVar42 = dVar41 * 0.0;
      dVar29 = -local_118;
      dVar31 = -dStack_110;
      dVar36 = -dVar43;
      dVar37 = dVar43 * 0.0;
      dVar33 = dVar21 + dVar35 + dVar24 + dVar37;
      dVar27 = dVar40 + dVar30 + dVar25 + dVar37;
      dVar37 = dVar42 + dVar38 + dVar22 + dVar37;
      dVar24 = dVar24 * 0.0;
      dVar20 = local_118 * 0.0;
      dVar23 = dStack_110 * 0.0;
      dVar35 = dVar24 + dVar32 + dVar35 + dVar20;
      dVar21 = dVar24 + dVar26 + dVar21 + dVar23;
      dVar25 = dVar25 * 0.0;
      dVar24 = dVar25 + dVar39 + dVar30 + dVar20;
      dVar25 = dVar25 + dVar34 + dVar40 + dVar23;
      dVar22 = dVar22 * 0.0;
      dVar20 = dVar22 + dVar41 + dVar38 + dVar20;
      dVar23 = dVar22 + dVar28 + dVar42 + dVar23;
      dVar30 = (dVar43 + 0.0) * 0.0;
      local_c8 = local_118 + 0.0;
      dStack_c0 = dStack_110 + 0.0;
      local_118 = local_c8 * 0.0;
      dStack_110 = dStack_c0 * 0.0;
      dVar22 = dVar21 + dVar25 * 0.0 + dVar23 * 0.0 + dStack_110;
      local_128._8_4_ = SUB84(dVar22,0);
      local_128._0_8_ = dVar35 + dVar24 * 0.0 + dVar20 * 0.0 + local_118;
      local_128._12_4_ = (int)((ulong)dVar22 >> 0x20);
      dVar26 = dVar35 * 0.0 + dVar24 + dVar20 * 0.0 + local_118;
      dVar28 = dVar21 * 0.0 + dVar25 + dVar23 * 0.0 + dStack_110;
      local_118 = local_118 + dVar20 + dVar35 * 0.0 + dVar24 * 0.0;
      dStack_110 = dStack_110 + dVar21 * 0.0 + dVar25 * 0.0 + dVar23;
      local_c8 = dVar36 * dVar20 + dVar29 * dVar35 + dVar31 * dVar24 + local_c8;
      dStack_c0 = dVar36 * dVar23 + dVar29 * dVar21 + dVar31 * dVar25 + dStack_c0;
      dVar22 = dVar33 + dVar27 * 0.0 + dVar37 * 0.0 + dVar30;
      dVar20 = dVar33 * 0.0 + dVar27 + dVar37 * 0.0 + dVar30;
      dVar30 = dVar33 * 0.0 + dVar27 * 0.0 + dVar37 + dVar30;
      dVar43 = dVar37 * dVar36 + dVar33 * dVar29 + dVar27 * dVar31 + dVar43 + 0.0;
      uVar17 = lVar13 * -0x5555555555555554;
      iVar6 = 0;
      uVar10 = local_190;
      lVar15 = 0;
      do {
        while (lVar18 = lVar15, paVar9 == paVar16) {
          iVar6 = iVar6 + 1;
          lVar15 = lVar18 + uVar17;
          if (iVar6 == (int)uVar10) goto LAB_0052cee4;
        }
        lVar15 = lVar18 * 0x18 + 0x48;
        uVar10 = 1;
        do {
          local_b8.a1 = (double)CONCAT44(local_b8.a1._4_4_,4);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                    (local_180,(uint *)&local_b8);
          paVar16 = (result->mVerts).
                    super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          local_b8.a3 = *(double *)((long)&paVar16->z + lVar15);
          pdVar2 = (double *)((long)&paVar16->x + lVar15);
          local_b8.a1 = *pdVar2;
          local_b8.a2 = pdVar2[1];
          lVar3 = lVar18 + 3 + (uVar10 % uVar14) * 4;
          local_178.z = paVar16[lVar3].z;
          local_178.x = paVar16[lVar3].x;
          local_178.y = paVar16[lVar3].y;
          iVar12._M_current =
               (result->mVerts).
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar12._M_current ==
              (result->mVerts).
              super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
            _M_realloc_insert<aiVector3t<double>const&>
                      ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)result,
                       iVar12,(aiVector3t<double> *)&local_b8);
            iVar12._M_current =
                 (result->mVerts).
                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
          }
          else {
            (iVar12._M_current)->z = local_b8.a3;
            (iVar12._M_current)->x = local_b8.a1;
            (iVar12._M_current)->y = local_b8.a2;
            iVar12._M_current =
                 (result->mVerts).
                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
            (result->mVerts).
            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar12._M_current;
          }
          if (iVar12._M_current ==
              (result->mVerts).
              super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
            _M_realloc_insert<aiVector3t<double>const&>
                      ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)result,
                       iVar12,&local_178);
            iVar12._M_current =
                 (result->mVerts).
                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
          }
          else {
            (iVar12._M_current)->z = local_178.z;
            (iVar12._M_current)->x = local_178.x;
            (iVar12._M_current)->y = local_178.y;
            iVar12._M_current =
                 (result->mVerts).
                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
            (result->mVerts).
            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar12._M_current;
          }
          local_1a8.x = local_178.z * local_118 +
                        local_178.x * (double)local_128._0_8_ + local_178.y * dVar26 + local_c8;
          local_1a8.y = local_178.z * dStack_110 +
                        local_178.x * (double)local_128._8_8_ + local_178.y * dVar28 + dStack_c0;
          local_1a8.z = dVar22 * local_178.x + dVar20 * local_178.y + dVar30 * local_178.z + dVar43;
          if (iVar12._M_current ==
              (result->mVerts).
              super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
            _M_realloc_insert<aiVector3t<double>>
                      ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)result,
                       iVar12,&local_1a8);
            iVar12._M_current =
                 (result->mVerts).
                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
          }
          else {
            (iVar12._M_current)->z = local_1a8.z;
            (iVar12._M_current)->x = local_1a8.x;
            (iVar12._M_current)->y = local_1a8.y;
            iVar12._M_current =
                 (result->mVerts).
                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
            (result->mVerts).
            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar12._M_current;
          }
          local_1a8.x = local_b8.a3 * local_118 +
                        local_b8.a1 * (double)local_128._0_8_ + local_b8.a2 * dVar26 + local_c8;
          local_1a8.y = local_b8.a3 * dStack_110 +
                        local_b8.a1 * (double)local_128._8_8_ + local_b8.a2 * dVar28 + dStack_c0;
          local_1a8.z = dVar22 * local_b8.a1 + dVar20 * local_b8.a2 + dVar30 * local_b8.a3 + dVar43;
          if (iVar12._M_current ==
              (result->mVerts).
              super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
            _M_realloc_insert<aiVector3t<double>>
                      ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)result,
                       iVar12,&local_1a8);
          }
          else {
            (iVar12._M_current)->z = local_1a8.z;
            (iVar12._M_current)->x = local_1a8.x;
            (iVar12._M_current)->y = local_1a8.y;
            ppaVar1 = &(result->mVerts).
                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
            *ppaVar1 = *ppaVar1 + 1;
          }
          lVar15 = lVar15 + 0x60;
          bVar19 = uVar10 != uVar8;
          uVar10 = uVar10 + 1;
        } while (bVar19);
        iVar6 = iVar6 + 1;
        uVar10 = local_190;
        paVar16 = local_188;
        lVar15 = lVar18 + uVar17;
      } while (iVar6 != (int)local_190);
      if (paVar9 != local_188) {
        paVar16 = (result->mVerts).
                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        __src = (pointer)(lVar13 * 0x20 + (long)paVar16);
        __n = (long)(result->mVerts).
                    super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)__src;
        paVar9 = __src;
        if (__n != 0) {
          memmove(paVar16,__src,__n);
          paVar9 = (result->mVerts).
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        }
        paVar16 = (pointer)((long)paVar16 + ((long)paVar9 - (long)__src));
        if (paVar9 != paVar16) {
          (result->mVerts).
          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
          super__Vector_impl_data._M_finish = paVar16;
        }
      }
LAB_0052cee4:
      pIVar4 = local_f0;
      if (bVar5) {
        lVar13 = (~uVar17 + lVar18 + uVar17) * 0x18;
        uVar8 = uVar14;
        do {
          paVar11 = (aiVector3t<double> *)
                    ((long)&((result->mVerts).
                             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->x + lVar13);
          iVar12._M_current =
               (result->mVerts).
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar12._M_current ==
              (result->mVerts).
              super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
            _M_realloc_insert<aiVector3t<double>const&>
                      ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)result,
                       iVar12,paVar11);
          }
          else {
            (iVar12._M_current)->z = paVar11->z;
            dVar22 = paVar11->y;
            (iVar12._M_current)->x = paVar11->x;
            (iVar12._M_current)->y = dVar22;
            ppaVar1 = &(result->mVerts).
                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
            *ppaVar1 = *ppaVar1 + 1;
          }
          uVar8 = uVar8 - 1;
          lVar13 = lVar13 + -0x60;
        } while (uVar8 != 0);
        lVar13 = 0;
        uVar8 = uVar14;
        do {
          paVar11 = (aiVector3t<double> *)
                    ((long)&((result->mVerts).
                             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->x + lVar13);
          iVar12._M_current =
               (result->mVerts).
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar12._M_current ==
              (result->mVerts).
              super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
            _M_realloc_insert<aiVector3t<double>const&>
                      ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)result,
                       iVar12,paVar11);
          }
          else {
            (iVar12._M_current)->z = paVar11->z;
            dVar22 = paVar11->y;
            (iVar12._M_current)->x = paVar11->x;
            (iVar12._M_current)->y = dVar22;
            ppaVar1 = &(result->mVerts).
                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
            *ppaVar1 = *ppaVar1 + 1;
          }
          this = local_180;
          lVar13 = lVar13 + 0x60;
          uVar8 = uVar8 - 1;
        } while (uVar8 != 0);
        local_b8.a1._0_4_ = (int)uVar14;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (local_180,(uint *)&local_b8);
        local_b8.a1 = (double)CONCAT44(local_b8.a1._4_4_,(int)uVar14);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (this,(uint *)&local_b8);
      }
      local_b8.a1 = 1.0;
      local_b8.a2 = 0.0;
      local_b8.a3 = 0.0;
      local_b8.a4 = 0.0;
      local_b8.b1 = 0.0;
      local_b8.b2 = 1.0;
      local_b8.b3 = 0.0;
      local_b8.b4 = 0.0;
      local_b8.c1 = 0.0;
      local_b8.c2 = 0.0;
      local_b8.c3 = 1.0;
      local_b8.c4 = 0.0;
      local_b8.d1 = 0.0;
      local_b8.d2 = 0.0;
      local_b8.d3 = 0.0;
      local_b8.d4 = 1.0;
      in_00 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D>
                        ((pIVar4->super_IfcSweptAreaSolid).Position.obj);
      ConvertAxisPlacement(&local_b8,in_00);
      TempMesh::Transform(result,&local_b8);
      LogFunctions<Assimp::IFCImporter>::LogDebug((char *)0x52d053);
    }
    else if (2 < uVar14 && iVar6 == 0) {
      std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::operator=
                (&result->mVerts,&local_158.mVerts);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                (&result->mVertcnt,&local_158.mVertcnt);
    }
  }
  if (local_158.mVertcnt.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_158.mVertcnt.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_158.mVertcnt.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_158.mVertcnt.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_158.mVerts.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_158.mVerts.
                    super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_158.mVerts.
                          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_158.mVerts.
                          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ProcessRevolvedAreaSolid(const Schema_2x3::IfcRevolvedAreaSolid& solid, TempMesh& result, ConversionData& conv)
{
    TempMesh meshout;

    // first read the profile description
    if(!ProcessProfile(*solid.SweptArea,meshout,conv) || meshout.mVerts.size()<=1) {
        return;
    }

    IfcVector3 axis, pos;
    ConvertAxisPlacement(axis,pos,solid.Axis);

    IfcMatrix4 tb0,tb1;
    IfcMatrix4::Translation(pos,tb0);
    IfcMatrix4::Translation(-pos,tb1);

    const std::vector<IfcVector3>& in = meshout.mVerts;
    const size_t size=in.size();

    bool has_area = solid.SweptArea->ProfileType == "AREA" && size>2;
    const IfcFloat max_angle = solid.Angle*conv.angle_scale;
    if(std::fabs(max_angle) < 1e-3) {
        if(has_area) {
            result = meshout;
        }
        return;
    }

    const unsigned int cnt_segments = std::max(2u,static_cast<unsigned int>(conv.settings.cylindricalTessellation * std::fabs(max_angle)/AI_MATH_HALF_PI_F));
    const IfcFloat delta = max_angle/cnt_segments;

    has_area = has_area && std::fabs(max_angle) < AI_MATH_TWO_PI_F*0.99;

    result.mVerts.reserve(size*((cnt_segments+1)*4+(has_area?2:0)));
    result.mVertcnt.reserve(size*cnt_segments+2);

    IfcMatrix4 rot;
    rot = tb0 * IfcMatrix4::Rotation(delta,axis,rot) * tb1;

    size_t base = 0;
    std::vector<IfcVector3>& out = result.mVerts;

    // dummy data to simplify later processing
    for(size_t i = 0; i < size; ++i) {
        out.insert(out.end(),4,in[i]);
    }

    for(unsigned int seg = 0; seg < cnt_segments; ++seg) {
        for(size_t i = 0; i < size; ++i) {
            const size_t next = (i+1)%size;

            result.mVertcnt.push_back(4);
            const IfcVector3 base_0 = out[base+i*4+3],base_1 = out[base+next*4+3];

            out.push_back(base_0);
            out.push_back(base_1);
            out.push_back(rot*base_1);
            out.push_back(rot*base_0);
        }
        base += size*4;
    }

    out.erase(out.begin(),out.begin()+size*4);

    if(has_area) {
        // leave the triangulation of the profile area to the ear cutting
        // implementation in aiProcess_Triangulate - for now we just
        // feed in two huge polygons.
        base -= size*8;
        for(size_t i = size; i--; ) {
            out.push_back(out[base+i*4+3]);
        }
        for(size_t i = 0; i < size; ++i ) {
            out.push_back(out[i*4]);
        }
        result.mVertcnt.push_back(static_cast<unsigned int>(size));
        result.mVertcnt.push_back(static_cast<unsigned int>(size));
    }

    IfcMatrix4 trafo;
    ConvertAxisPlacement(trafo, solid.Position);

    result.Transform(trafo);
    IFCImporter::LogDebug("generate mesh procedurally by radial extrusion (IfcRevolvedAreaSolid)");
}